

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SEnumVal.cpp
# Opt level: O0

void processAttributes(XMLAttDefList *attList,bool margin)

{
  AttTypes AVar1;
  DefAttTypes DVar2;
  ulong uVar3;
  ulong uVar4;
  ostream *poVar5;
  XMLCh *pXVar6;
  DatatypeValidator *dtValidator;
  DatatypeValidator *dv;
  StrX local_50;
  StrX local_48;
  StrX local_40 [3];
  StrX local_28;
  XMLAttDef *local_20;
  SchemaAttDef *curAttDef;
  uint i;
  bool margin_local;
  XMLAttDefList *attList_local;
  
  curAttDef._7_1_ = margin;
  _i = attList;
  uVar3 = (**(code **)(*(long *)attList + 0x28))();
  if ((uVar3 & 1) == 0) {
    if ((curAttDef._7_1_ & 1) != 0) {
      std::operator<<((ostream *)&std::cout,"\t");
    }
    std::operator<<((ostream *)&std::cout,"Attributes:\n");
    for (curAttDef._0_4_ = 0; uVar3 = (ulong)(uint)curAttDef,
        uVar4 = (**(code **)(*(long *)_i + 0x50))(), uVar3 < uVar4;
        curAttDef._0_4_ = (uint)curAttDef + 1) {
      local_20 = (XMLAttDef *)(**(code **)(*(long *)_i + 0x58))(_i,(uint)curAttDef);
      poVar5 = std::operator<<((ostream *)&std::cout,"\tName:\t\t\t");
      pXVar6 = (XMLCh *)(**(code **)(*(long *)local_20 + 0x28))();
      StrX::StrX(&local_28,pXVar6);
      poVar5 = operator<<(poVar5,&local_28);
      std::operator<<(poVar5,"\n");
      StrX::~StrX(&local_28);
      std::operator<<((ostream *)&std::cout,"\tType:\t\t\t");
      AVar1 = xercesc_4_0::XMLAttDef::getType(local_20);
      pXVar6 = (XMLCh *)xercesc_4_0::XMLAttDef::getAttTypeString
                                  (AVar1,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      StrX::StrX(local_40,pXVar6);
      operator<<((ostream *)&std::cout,local_40);
      StrX::~StrX(local_40);
      std::operator<<((ostream *)&std::cout,"\n");
      std::operator<<((ostream *)&std::cout,"\tDefault Type:\t");
      DVar2 = xercesc_4_0::XMLAttDef::getDefaultType(local_20);
      pXVar6 = (XMLCh *)xercesc_4_0::XMLAttDef::getDefAttTypeString
                                  (DVar2,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      StrX::StrX(&local_48,pXVar6);
      operator<<((ostream *)&std::cout,&local_48);
      StrX::~StrX(&local_48);
      std::operator<<((ostream *)&std::cout,"\n");
      pXVar6 = xercesc_4_0::XMLAttDef::getValue(local_20);
      if (pXVar6 != (XMLCh *)0x0) {
        std::operator<<((ostream *)&std::cout,"\tValue:\t\t\t");
        pXVar6 = xercesc_4_0::XMLAttDef::getValue(local_20);
        StrX::StrX(&local_50,pXVar6);
        operator<<((ostream *)&std::cout,&local_50);
        StrX::~StrX(&local_50);
        std::operator<<((ostream *)&std::cout,"\n");
      }
      pXVar6 = xercesc_4_0::XMLAttDef::getEnumeration(local_20);
      if (pXVar6 != (XMLCh *)0x0) {
        std::operator<<((ostream *)&std::cout,"\tEnumeration:\t");
        pXVar6 = xercesc_4_0::XMLAttDef::getEnumeration(local_20);
        StrX::StrX((StrX *)&dv,pXVar6);
        operator<<((ostream *)&std::cout,(StrX *)&dv);
        StrX::~StrX((StrX *)&dv);
        std::operator<<((ostream *)&std::cout,"\n");
      }
      dtValidator = xercesc_4_0::SchemaAttDef::getDatatypeValidator((SchemaAttDef *)local_20);
      processDatatypeValidator(dtValidator,true);
      std::operator<<((ostream *)&std::cout,"\n");
    }
  }
  return;
}

Assistant:

void processAttributes( XMLAttDefList& attList, bool margin )
{
    if ( attList.isEmpty() )
    {
        return;
    }

    if ( margin )
    {
        std::cout << "\t";
    }

    std::cout << "Attributes:\n";
    for (unsigned int i=0; i<attList.getAttDefCount(); i++)
    {
        // Name
        SchemaAttDef& curAttDef = (SchemaAttDef&)attList.getAttDef(i);
        std::cout << "\tName:\t\t\t" << StrX(curAttDef.getFullName()) << "\n";

        // Type
        std::cout << "\tType:\t\t\t";
		std::cout << StrX(XMLAttDef::getAttTypeString(curAttDef.getType()));
        std::cout << "\n";

        // Default Type
        std::cout << "\tDefault Type:\t";
		std::cout << StrX(XMLAttDef::getDefAttTypeString(curAttDef.getDefaultType()));
        std::cout << "\n";

        // Value
        if( curAttDef.getValue() )
        {
            std::cout << "\tValue:\t\t\t";
            std::cout << StrX(curAttDef.getValue());
            std::cout << "\n";
        }

        // Enum. values
        if( curAttDef.getEnumeration() )
        {
            std::cout << "\tEnumeration:\t";
            std::cout << StrX(curAttDef.getEnumeration());
            std::cout << "\n";
        }

         const DatatypeValidator* dv = curAttDef.getDatatypeValidator();
         processDatatypeValidator( dv, true );

        std::cout << "\n";
    }
}